

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void CreateBackwardReferencesDH6
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  uint8_t *puVar1;
  long *plVar2;
  uint32_t *puVar3;
  ushort uVar4;
  undefined4 uVar5;
  size_t sVar6;
  size_t sVar7;
  uint32_t *puVar8;
  uint32_t *puVar9;
  BrotliEncoderDictionary *pBVar10;
  uint64_t uVar11;
  ulong uVar12;
  ulong uVar13;
  HasherCommon *pHVar14;
  size_t sVar15;
  PreparedDictionary *pPVar16;
  BrotliDictionary *pBVar17;
  undefined8 uVar18;
  bool bVar19;
  int iVar20;
  byte bVar21;
  uint32_t uVar22;
  uint32_t *puVar23;
  uint8_t *puVar24;
  uint32_t *puVar25;
  ulong *puVar26;
  size_t sVar27;
  ulong *puVar28;
  undefined8 *puVar29;
  undefined8 *puVar30;
  uint8_t *puVar31;
  byte bVar32;
  long lVar33;
  uint32_t *puVar34;
  ulong uVar35;
  ulong *puVar36;
  uint8_t *puVar37;
  uint uVar38;
  int iVar39;
  long lVar40;
  uint8_t *puVar41;
  uint32_t *puVar42;
  uint32_t *puVar43;
  uint *puVar44;
  ulong uVar45;
  uint8_t *puVar46;
  uint16_t uVar47;
  int iVar48;
  ulong *puVar49;
  Command *pCVar50;
  Command *pCVar51;
  undefined8 *puVar52;
  byte bVar53;
  ulong *puVar54;
  uint32_t *puVar55;
  int iVar56;
  ulong uVar57;
  long lVar58;
  long lVar59;
  uint8_t *puVar60;
  uint8_t *puVar61;
  uint32_t *puVar62;
  ulong uVar63;
  uint8_t *puVar64;
  uint32_t *puVar65;
  uint uVar66;
  uint uVar67;
  undefined8 *puVar68;
  uint8_t *s1_orig_1;
  Command *pCVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  size_t sVar73;
  bool bVar74;
  ulong local_1a0;
  uint32_t *local_198;
  uint32_t *local_188;
  int local_174;
  ulong local_170;
  uint32_t *local_158;
  uint32_t *local_148;
  uint32_t *local_140;
  uint32_t *local_130;
  Command *local_100;
  uint32_t *local_e8;
  uint local_d4;
  uint8_t *s1_orig;
  uint8_t *s1_orig_4;
  ulong local_68;
  int last_distance;
  
  iVar39 = params->lgwin;
  sVar6 = params->stream_offset;
  uVar45 = *last_insert_len;
  puVar23 = (uint32_t *)((position - 7) + num_bytes);
  if (num_bytes < 8) {
    puVar23 = (uint32_t *)position;
  }
  lVar33 = 0x200;
  if (params->quality < 9) {
    lVar33 = 0x40;
  }
  puVar1 = (uint8_t *)(position + num_bytes);
  sVar7 = (params->dictionary).compound.total_size;
  iVar48 = (hasher->privat)._H6.num_last_distances_to_check_;
  if (4 < iVar48) {
    iVar56 = *dist_cache;
    dist_cache[4] = iVar56 + -1;
    dist_cache[5] = iVar56 + 1;
    dist_cache[6] = iVar56 + -2;
    dist_cache[7] = iVar56 + 2;
    *(ulong *)(dist_cache + 8) = CONCAT44(iVar56 + 3,iVar56 + -3);
    if (10 < iVar48) {
      iVar48 = dist_cache[1];
      dist_cache[10] = iVar48 + -1;
      dist_cache[0xb] = iVar48 + 1;
      dist_cache[0xc] = iVar48 + -2;
      dist_cache[0xd] = iVar48 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar48 + 3,iVar48 + -3);
    }
  }
  if ((uint8_t *)(position + 8) < puVar1) {
    puVar3 = (uint32_t *)((1L << ((byte)iVar39 & 0x3f)) - 0x10);
    puVar46 = (uint8_t *)(lVar33 + position);
    puVar8 = (hasher->privat)._H5.buckets_;
    puVar9 = (hasher->privat)._H6.buckets_;
    lVar40 = sVar7 + 1;
    puVar24 = puVar1 + -7;
    local_100 = commands;
    local_148 = (uint32_t *)position;
    do {
      puVar65 = puVar3;
      if (local_148 < puVar3) {
        puVar65 = local_148;
      }
      puVar34 = (uint32_t *)((long)local_148 + sVar6);
      if (puVar3 <= (uint32_t *)((long)local_148 + sVar6)) {
        puVar34 = puVar3;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        local_d4 = 0;
        local_68 = 0;
      }
      else {
        if (local_148 == (uint32_t *)0x0) {
          local_68 = 0;
        }
        else {
          local_68 = (ulong)ringbuffer[(ulong)((long)local_148 - 1U) & ringbuffer_mask];
        }
        if (local_148 < (uint32_t *)0x2) {
          uVar57 = 0;
        }
        else {
          uVar57 = (ulong)ringbuffer[(ulong)((long)local_148 - 2U) & ringbuffer_mask];
        }
        local_d4 = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[uVar57 + 0x100] | literal_context_lut[local_68]];
      }
      local_140 = (uint32_t *)(puVar1 + -(long)local_148);
      pBVar10 = (params->dictionary).contextual.dict[local_d4];
      puVar31 = (uint8_t *)(params->dist).max_distance;
      uVar57 = (ulong)local_148 & ringbuffer_mask;
      uVar63 = (ulong)(hasher->privat)._H6.num_last_distances_to_check_;
      if (uVar63 == 0) {
        local_170 = 0x7e4;
        local_158 = (uint32_t *)0x0;
        local_188 = (uint32_t *)0x0;
        puVar43 = (uint32_t *)0x0;
      }
      else {
        local_170 = 0x7e4;
        puVar43 = (uint32_t *)0x0;
        uVar71 = 0;
        local_188 = (uint32_t *)0x0;
        local_158 = (uint32_t *)0x0;
        do {
          puVar25 = (uint32_t *)(long)dist_cache[uVar71];
          if (((puVar25 <= puVar65) && ((uint8_t *)((long)local_148 - (long)puVar25) < local_148))
             && ((uint8_t *)((long)puVar43 + uVar57) <= ringbuffer_mask)) {
            uVar35 = (ulong)((long)local_148 - (long)puVar25) & ringbuffer_mask;
            puVar41 = (uint8_t *)((long)puVar43 + uVar35);
            if ((puVar41 <= ringbuffer_mask) &&
               (ringbuffer[(long)((long)puVar43 + uVar57)] == ringbuffer[(long)puVar41])) {
              puVar36 = (ulong *)(ringbuffer + uVar35);
              puVar55 = local_140;
              puVar26 = (ulong *)(ringbuffer + uVar57);
              puVar54 = puVar36;
              for (puVar42 = local_140; (uint32_t *)0x7 < puVar42; puVar42 = puVar42 + -2) {
                uVar35 = *puVar26;
                uVar72 = *puVar54;
                if (uVar35 == uVar72) {
                  puVar54 = puVar54 + 1;
                }
                else {
                  uVar70 = 0;
                  if ((uVar72 ^ uVar35) != 0) {
                    for (; ((uVar72 ^ uVar35) >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
                    }
                  }
                  puVar55 = (uint32_t *)
                            ((long)puVar54 + ((uVar70 >> 3 & 0x1fffffff) - (long)puVar36));
                }
                if (uVar35 != uVar72) goto LAB_00303e68;
                puVar26 = puVar26 + 1;
              }
              if (puVar42 != (uint32_t *)0x0) {
                puVar55 = (uint32_t *)0x0;
                do {
                  puVar62 = puVar55;
                  if (*(uint8_t *)((long)puVar54 + (long)puVar55) !=
                      *(uint8_t *)((long)puVar26 + (long)puVar55)) break;
                  puVar55 = (uint32_t *)((long)puVar55 + 1);
                  puVar62 = puVar42;
                } while (puVar42 != puVar55);
                puVar54 = (ulong *)((long)puVar54 + (long)puVar62);
              }
              puVar55 = (uint32_t *)((long)puVar54 - (long)puVar36);
LAB_00303e68:
              if ((((uint32_t *)0x2 < puVar55) || ((uVar71 < 2 && (puVar55 == (uint32_t *)0x2)))) &&
                 (uVar35 = (long)puVar55 * 0x87 + 0x78f, local_170 < uVar35)) {
                if (uVar71 != 0) {
                  uVar35 = uVar35 - ((0x1ca10U >> ((byte)uVar71 & 0xe) & 0xe) + 0x27);
                }
                if (local_170 < uVar35) {
                  puVar43 = puVar55;
                  local_188 = puVar55;
                  local_170 = uVar35;
                  local_158 = puVar25;
                }
              }
            }
          }
          uVar71 = uVar71 + 1;
        } while (uVar71 != uVar63);
      }
      uVar11 = (hasher->privat)._H6.hash_mul_;
      plVar2 = (long *)(ringbuffer + uVar57);
      uVar72 = *plVar2 * uVar11 >> 0x31;
      puVar26 = (ulong *)(ringbuffer + uVar57);
      uVar63 = (hasher->privat)._H5.block_size_;
      uVar4 = *(ushort *)((long)puVar8 + uVar72 * 2);
      uVar35 = (ulong)uVar4;
      uVar71 = 0;
      if (uVar63 <= uVar35) {
        uVar71 = uVar35 - uVar63;
      }
      pCVar69 = (Command *)(puVar9 + (uVar72 << (*(byte *)((long)&hasher->privat + 0x1c) & 0x3f)));
      do {
        if (uVar35 <= uVar71) break;
        uVar35 = uVar35 - 1;
        puVar25 = (uint32_t *)
                  ((long)local_148 -
                  (ulong)(&pCVar69->insert_len_)[(hasher->privat)._H6.block_mask_ & (uint)uVar35]);
        if ((puVar25 <= puVar65) && ((uint8_t *)((long)puVar43 + uVar57) <= ringbuffer_mask)) {
          uVar70 = (ulong)((&pCVar69->insert_len_)[(hasher->privat)._H6.block_mask_ & (uint)uVar35]
                          & (uint)ringbuffer_mask);
          if (((uint8_t *)((long)puVar43 + uVar70) <= ringbuffer_mask) &&
             ((ringbuffer[(long)((long)puVar43 + uVar57)] ==
               ringbuffer[(long)((long)puVar43 + uVar70)] &&
              ((int)*plVar2 == *(int *)(ringbuffer + uVar70))))) {
            puVar49 = (ulong *)(ringbuffer + uVar70 + 4);
            puVar54 = (ulong *)((long)plVar2 + 4);
            puVar36 = puVar49;
            uVar70 = uVar45;
            for (puVar41 = (uint8_t *)(local_140 + -1); (uint8_t *)0x7 < puVar41;
                puVar41 = puVar41 + 0xfffffffffffffff8) {
              uVar12 = *puVar54;
              uVar13 = *puVar36;
              if (uVar12 == uVar13) {
                puVar36 = puVar36 + 1;
              }
              else {
                uVar70 = 0;
                if ((uVar13 ^ uVar12) != 0) {
                  for (; ((uVar13 ^ uVar12) >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
                  }
                }
                uVar70 = (long)puVar36 + ((uVar70 >> 3 & 0x1fffffff) - (long)puVar49);
              }
              if (uVar12 != uVar13) goto LAB_003040a1;
              puVar54 = puVar54 + 1;
            }
            if (puVar41 != (uint8_t *)0x0) {
              puVar64 = (uint8_t *)0x0;
              do {
                puVar60 = puVar64;
                if (*(uint8_t *)((long)puVar36 + (long)puVar64) !=
                    *(uint8_t *)((long)puVar54 + (long)puVar64)) break;
                puVar64 = puVar64 + 1;
                puVar60 = puVar41;
              } while (puVar41 != puVar64);
              puVar36 = (ulong *)((long)puVar36 + (long)puVar60);
            }
            uVar70 = (long)puVar36 - (long)puVar49;
LAB_003040a1:
            puVar42 = (uint32_t *)(uVar70 + 4);
            iVar39 = 0x1f;
            if ((uint)puVar25 != 0) {
              for (; (uint)puVar25 >> iVar39 == 0; iVar39 = iVar39 + -1) {
              }
            }
            uVar70 = (ulong)(iVar39 * -0x1e + 0x780) + (long)puVar42 * 0x87;
            if (local_170 < uVar70) {
              puVar43 = puVar42;
              local_188 = puVar42;
              local_170 = uVar70;
              local_158 = puVar25;
            }
          }
        }
      } while (puVar25 <= puVar65);
      (&pCVar69->insert_len_)[(hasher->privat)._H6.block_mask_ & (uint)uVar4] = (uint32_t)local_148;
      *(ushort *)((long)puVar8 + uVar72 * 2) = uVar4 + 1;
      if (local_170 == 0x7e4) {
        pHVar14 = (hasher->privat)._H6.common_;
        if (pHVar14->dict_num_matches < pHVar14->dict_num_lookups >> 7) {
          local_174 = 0;
        }
        else {
          puVar65 = (uint32_t *)(ulong)((uint)((int)*puVar26 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
          puVar41 = pBVar10->hash_table_lengths;
          sVar73 = pHVar14->dict_num_lookups;
          local_174 = 0;
          pCVar50 = (Command *)0x0;
          do {
            sVar73 = sVar73 + 1;
            pHVar14->dict_num_lookups = sVar73;
            bVar32 = puVar41[(long)puVar65];
            puVar64 = (uint8_t *)(ulong)bVar32;
            if (puVar64 != (uint8_t *)0x0) {
              bVar74 = true;
              if (puVar64 <= local_140) {
                pBVar17 = pBVar10->words;
                puVar36 = (ulong *)(pBVar17->data +
                                   (ulong)pBVar17->offsets_by_length[(long)puVar64] +
                                   (ulong)pBVar10->hash_table_words[(long)puVar65] * (long)puVar64);
                puVar54 = puVar26;
                puVar60 = puVar64;
                puVar43 = (uint32_t *)ringbuffer_mask;
                if (7 < bVar32) {
                  do {
                    uVar71 = *puVar36;
                    uVar35 = *puVar54;
                    if (uVar71 == uVar35) {
                      puVar54 = puVar54 + 1;
                    }
                    else {
                      uVar72 = 0;
                      if ((uVar35 ^ uVar71) != 0) {
                        for (; ((uVar35 ^ uVar71) >> uVar72 & 1) == 0; uVar72 = uVar72 + 1) {
                        }
                      }
                      puVar43 = (uint32_t *)
                                ((long)puVar54 + ((uVar72 >> 3 & 0x1fffffff) - (long)puVar26));
                    }
                    if (uVar71 != uVar35) goto LAB_00305225;
                    puVar36 = puVar36 + 1;
                    puVar60 = puVar60 + -8;
                  } while ((uint8_t *)0x7 < puVar60);
                }
                puVar49 = puVar54;
                if (puVar60 != (uint8_t *)0x0) {
                  puVar49 = (ulong *)((long)puVar54 + (long)puVar60);
                  lVar58 = 0;
                  do {
                    if (*(char *)((long)puVar54 + lVar58) != *(char *)((long)puVar36 + lVar58)) {
                      puVar49 = (ulong *)((long)puVar54 + lVar58);
                      break;
                    }
                    lVar58 = lVar58 + 1;
                  } while (puVar60 != (uint8_t *)lVar58);
                }
                puVar43 = (uint32_t *)((long)puVar49 - (long)puVar26);
LAB_00305225:
                if (((puVar43 != (uint32_t *)0x0) &&
                    (puVar64 < (uint8_t *)((long)puVar43 + (ulong)pBVar10->cutoffTransformsCount)))
                   && (puVar25 = (uint32_t *)
                                 ((long)puVar34 +
                                 ((ulong)((uint)(pBVar10->cutoffTransforms >>
                                                ((char)((long)puVar64 - (long)puVar43) * '\x06' &
                                                0x3fU)) & 0x3f) +
                                  ((long)puVar64 - (long)puVar43) * 4 <<
                                 (puVar64[(long)pBVar17] & 0x3f)) +
                                 (ulong)pBVar10->hash_table_words[(long)puVar65] + lVar40),
                      puVar25 <= puVar31)) {
                  iVar39 = 0x1f;
                  if ((uint)puVar25 != 0) {
                    for (; (uint)puVar25 >> iVar39 == 0; iVar39 = iVar39 + -1) {
                    }
                  }
                  uVar71 = ((long)puVar43 * 0x87 - (ulong)(uint)(iVar39 * 0x1e)) + 0x780;
                  if (local_170 <= uVar71) {
                    local_174 = (uint)bVar32 - (int)puVar43;
                    bVar74 = false;
                    local_188 = puVar43;
                    local_170 = uVar71;
                    local_158 = puVar25;
                  }
                }
              }
              if (!bVar74) {
                pHVar14->dict_num_matches = pHVar14->dict_num_matches + 1;
              }
            }
            pCVar69 = (Command *)((long)&pCVar50->insert_len_ + 1);
            puVar65 = (uint32_t *)((long)puVar65 + 1);
            bVar74 = pCVar50 == (Command *)0x0;
            pCVar50 = pCVar69;
          } while (bVar74);
        }
      }
      else {
        local_174 = 0;
      }
      sVar73 = (params->dictionary).compound.num_chunks;
      sVar15 = (params->dictionary).compound.total_size;
      local_e8 = local_188;
      if (sVar73 != 0) {
        sVar27 = 0;
        do {
          pPVar16 = (params->dictionary).compound.chunks[sVar27];
          bVar32 = (byte)pPVar16->bucket_bits;
          bVar53 = (byte)pPVar16->slot_bits;
          lVar58 = 1L << (bVar32 & 0x3f);
          bVar21 = -(char)pPVar16->hash_bits;
          uVar71 = ((*puVar26 << (bVar21 & 0x3f)) >> (bVar21 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                   (-bVar32 & 0x3f);
          puVar65 = &pPVar16[1].magic + (1L << (bVar53 & 0x3f));
          bVar53 = -bVar53;
          puVar43 = (uint32_t *)((long)puVar65 + (ulong)pPVar16->num_items * 4 + lVar58 * 2);
          if (pPVar16->magic != 0xdebcede0) {
            puVar43 = *(uint32_t **)puVar43;
          }
          puVar41 = (uint8_t *)
                    ((long)puVar34 + (sVar15 - (params->dictionary).compound.chunk_offsets[sVar27]))
          ;
          uVar35 = (ulong)pPVar16->source_size;
          uVar4 = *(ushort *)((long)puVar65 + (uVar71 & 0xffffffff) * 2);
          puVar44 = (uint *)((long)puVar65 +
                            (ulong)((uint)uVar4 +
                                   (&pPVar16[1].magic)
                                   [(uint)((int)uVar71 << (bVar53 & 0x1f)) >> (bVar53 & 0x1f)]) * 4
                            + lVar58 * 2);
          lVar58 = 0;
          local_e8 = local_188;
          do {
            puVar25 = (uint32_t *)(long)dist_cache[lVar58];
            if ((puVar41 + -uVar35 < puVar25) &&
               (pCVar69 = (Command *)(puVar41 + -(long)puVar25), puVar25 <= puVar41)) {
              puVar65 = (uint32_t *)(uVar35 - (long)pCVar69);
              if (local_140 <= (uint32_t *)(uVar35 - (long)pCVar69)) {
                puVar65 = local_140;
              }
              pCVar69 = (Command *)((long)puVar43 + (long)&pCVar69->insert_len_);
              puVar54 = puVar26;
              pCVar50 = pCVar69;
              puVar42 = local_188;
              for (; (uint32_t *)0x7 < puVar65; puVar65 = puVar65 + -2) {
                uVar71 = *puVar54;
                uVar72._0_4_ = pCVar50->insert_len_;
                uVar72._4_4_ = pCVar50->copy_len_;
                if (uVar71 == uVar72) {
                  pCVar50 = (Command *)&pCVar50->dist_extra_;
                }
                else {
                  uVar70 = 0;
                  if ((uVar72 ^ uVar71) != 0) {
                    for (; ((uVar72 ^ uVar71) >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
                    }
                  }
                  puVar42 = (uint32_t *)
                            ((long)pCVar50 + ((uVar70 >> 3 & 0x1fffffff) - (long)pCVar69));
                }
                if (uVar71 != uVar72) goto LAB_003042f9;
                puVar54 = puVar54 + 1;
              }
              pCVar51 = pCVar50;
              if (puVar65 != (uint32_t *)0x0) {
                pCVar51 = (Command *)((long)puVar65 + (long)&pCVar50->insert_len_);
                lVar59 = 0;
                do {
                  if (*(char *)(lVar59 + (long)&pCVar50->insert_len_) !=
                      *(char *)((long)puVar54 + lVar59)) {
                    pCVar51 = (Command *)(lVar59 + (long)&pCVar50->insert_len_);
                    break;
                  }
                  lVar59 = lVar59 + 1;
                } while (puVar65 != (uint32_t *)lVar59);
              }
              puVar42 = (uint32_t *)((long)pCVar51 - (long)pCVar69);
LAB_003042f9:
              if (((uint32_t *)0x1 < puVar42) &&
                 (uVar71 = (long)puVar42 * 0x87 + 0x78f, local_170 < uVar71)) {
                if (lVar58 != 0) {
                  uVar71 = uVar71 - ((0x1ca10U >> ((byte)lVar58 & 2) & 4) + 0x27);
                }
                if (local_170 < uVar71) {
                  if (local_188 < puVar42) {
                    local_188 = puVar42;
                  }
                  local_174 = 0;
                  local_170 = uVar71;
                  local_158 = puVar25;
                  local_e8 = puVar42;
                }
              }
            }
            lVar58 = lVar58 + 1;
          } while (lVar58 != 4);
          if (uVar4 != 0xffff) {
            do {
              uVar38 = *puVar44;
              uVar71 = (ulong)(uVar38 & 0x7fffffff);
              puVar42 = (uint32_t *)(puVar41 + -uVar71);
              puVar25 = (uint32_t *)(uVar35 - uVar71);
              if (local_140 <= (uint32_t *)(uVar35 - uVar71)) {
                puVar25 = local_140;
              }
              if ((((puVar42 <= puVar31) &&
                   ((uint8_t *)((long)local_188 + uVar57) <= ringbuffer_mask)) &&
                  (local_188 < puVar25)) &&
                 (puVar65 = puVar43,
                 ringbuffer[(long)((long)local_188 + uVar57)] ==
                 *(uint8_t *)((long)puVar43 + (long)((long)local_188 + uVar71)))) {
                puVar49 = (ulong *)((long)puVar43 + uVar71);
                puVar54 = puVar26;
                puVar36 = puVar49;
                for (; (uint32_t *)0x7 < puVar25; puVar25 = puVar25 + -2) {
                  uVar71 = *puVar54;
                  uVar72 = *puVar36;
                  if (uVar71 == uVar72) {
                    puVar36 = puVar36 + 1;
                  }
                  else {
                    uVar70 = 0;
                    if ((uVar72 ^ uVar71) != 0) {
                      for (; ((uVar72 ^ uVar71) >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
                      }
                    }
                    pCVar69 = (Command *)((long)puVar36 - (long)puVar49);
                    puVar65 = (uint32_t *)((long)&pCVar69->insert_len_ + (uVar70 >> 3 & 0x1fffffff))
                    ;
                  }
                  if (uVar71 != uVar72) goto LAB_00304474;
                  puVar54 = puVar54 + 1;
                }
                puVar28 = puVar36;
                if (puVar25 != (uint32_t *)0x0) {
                  puVar28 = (ulong *)((long)puVar36 + (long)puVar25);
                  lVar58 = 0;
                  do {
                    if (*(char *)((long)puVar36 + lVar58) != *(char *)((long)puVar54 + lVar58)) {
                      puVar28 = (ulong *)((long)puVar36 + lVar58);
                      break;
                    }
                    lVar58 = lVar58 + 1;
                  } while (puVar25 != (uint32_t *)lVar58);
                }
                puVar65 = (uint32_t *)((long)puVar28 - (long)puVar49);
LAB_00304474:
                if ((uint32_t *)0x3 < puVar65) {
                  iVar39 = 0x1f;
                  if ((uint)puVar42 != 0) {
                    for (; (uint)puVar42 >> iVar39 == 0; iVar39 = iVar39 + -1) {
                    }
                  }
                  uVar71 = (ulong)(iVar39 * -0x1e + 0x780) + (long)puVar65 * 0x87;
                  if (local_170 < uVar71) {
                    local_174 = 0;
                    local_188 = puVar65;
                    local_170 = uVar71;
                    local_158 = puVar42;
                    local_e8 = puVar65;
                  }
                }
              }
              puVar44 = puVar44 + 1;
            } while (-1 < (int)uVar38);
          }
          sVar27 = sVar27 + 1;
          local_188 = local_e8;
        } while (sVar27 != sVar73);
      }
      if (local_170 < 0x7e5) {
        uVar45 = uVar45 + 1;
        position = (long)local_148 + 1;
        if (puVar46 < position) {
          if (puVar46 + (uint)((int)lVar33 * 4) < position) {
            puVar31 = (uint8_t *)((long)local_148 + 0x11U);
            if (puVar24 <= (uint8_t *)((long)local_148 + 0x11U)) {
              puVar31 = puVar24;
            }
            if (position < puVar31) {
              uVar38 = (hasher->privat)._H6.block_mask_;
              uVar5 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
              do {
                uVar57 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar11 >> 0x31;
                uVar4 = *(ushort *)((long)puVar8 + uVar57 * 2);
                *(ushort *)((long)puVar8 + uVar57 * 2) = uVar4 + 1;
                puVar9[(uVar57 << ((byte)uVar5 & 0x3f)) + (ulong)(uVar38 & uVar4)] =
                     (uint32_t)position;
                uVar45 = uVar45 + 4;
                position = position + 4;
              } while (position < puVar31);
            }
          }
          else {
            puVar31 = (uint8_t *)((long)local_148 + 9U);
            if (puVar24 <= (uint8_t *)((long)local_148 + 9U)) {
              puVar31 = puVar24;
            }
            if (position < puVar31) {
              uVar38 = (hasher->privat)._H6.block_mask_;
              uVar5 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
              do {
                uVar57 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar11 >> 0x31;
                uVar4 = *(ushort *)((long)puVar8 + uVar57 * 2);
                *(ushort *)((long)puVar8 + uVar57 * 2) = uVar4 + 1;
                puVar9[(uVar57 << ((byte)uVar5 & 0x3f)) + (ulong)(uVar38 & uVar4)] =
                     (uint32_t)position;
                uVar45 = uVar45 + 2;
                position = position + 2;
              } while (position < puVar31);
            }
          }
        }
      }
      else {
        iVar39 = (hasher->privat)._H6.num_last_distances_to_check_;
        uVar38 = (hasher->privat)._H6.block_mask_;
        uVar5 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
        iVar48 = 0;
        do {
          puVar34 = local_148;
          puVar46 = (uint8_t *)((long)local_140 - 1);
          puVar43 = (uint32_t *)((long)local_e8 - 1U);
          if (puVar46 <= (uint8_t *)((long)local_e8 - 1U)) {
            puVar43 = (uint32_t *)puVar46;
          }
          if (4 < params->quality) {
            puVar43 = (uint32_t *)0x0;
          }
          puVar41 = (uint8_t *)((long)local_148 + 1);
          puVar25 = puVar3;
          if (puVar41 < puVar3) {
            puVar25 = (uint32_t *)puVar41;
          }
          puVar42 = (uint32_t *)((long)local_148 + sVar6 + 1);
          if (puVar3 <= puVar42) {
            puVar42 = puVar3;
          }
          if ((params->dictionary).contextual.context_based != 0) {
            local_d4 = (uint)(params->dictionary).contextual.context_map
                             [literal_context_lut[local_68 + 0x100] |
                              literal_context_lut[ringbuffer[(ulong)local_148 & ringbuffer_mask]]];
            local_68 = (ulong)ringbuffer[(ulong)local_148 & ringbuffer_mask];
          }
          uVar57 = (ulong)puVar41 & ringbuffer_mask;
          pBVar10 = (params->dictionary).contextual.dict[local_d4];
          if (iVar39 == 0) {
            local_1a0 = 0x7e4;
            local_130 = (uint32_t *)0x0;
            local_198 = (uint32_t *)0x0;
          }
          else {
            local_1a0 = 0x7e4;
            uVar71 = 0;
            local_198 = (uint32_t *)0x0;
            local_130 = (uint32_t *)0x0;
            do {
              puVar55 = (uint32_t *)(long)dist_cache[uVar71];
              if (((puVar55 <= puVar25) && (puVar41 + -(long)puVar55 < puVar41)) &&
                 ((uint8_t *)((long)puVar43 + uVar57) <= ringbuffer_mask)) {
                uVar35 = (ulong)(puVar41 + -(long)puVar55) & ringbuffer_mask;
                puVar64 = (uint8_t *)((long)puVar43 + uVar35);
                if ((puVar64 <= ringbuffer_mask) &&
                   (ringbuffer[(long)((long)puVar43 + uVar57)] == ringbuffer[(long)puVar64])) {
                  puVar37 = ringbuffer + uVar35;
                  puVar62 = (uint32_t *)puVar46;
                  puVar64 = ringbuffer + uVar57;
                  puVar60 = puVar37;
                  for (puVar65 = (uint32_t *)puVar46; (uint32_t *)0x7 < puVar65;
                      puVar65 = puVar65 + -2) {
                    pCVar50 = *(Command **)puVar64;
                    pCVar69 = *(Command **)puVar60;
                    if (pCVar50 == pCVar69) {
                      puVar60 = puVar60 + 8;
                    }
                    else {
                      uVar35 = 0;
                      if (((ulong)pCVar69 ^ (ulong)pCVar50) != 0) {
                        for (; (((ulong)pCVar69 ^ (ulong)pCVar50) >> uVar35 & 1) == 0;
                            uVar35 = uVar35 + 1) {
                        }
                      }
                      puVar62 = (uint32_t *)(puVar60 + ((uVar35 >> 3 & 0x1fffffff) - (long)puVar37))
                      ;
                    }
                    if (pCVar50 != pCVar69) goto LAB_0030471a;
                    puVar64 = puVar64 + 8;
                  }
                  puVar61 = puVar60;
                  if (puVar65 != (uint32_t *)0x0) {
                    puVar61 = puVar60 + (long)puVar65;
                    lVar58 = 0;
                    do {
                      if (puVar60[lVar58] != puVar64[lVar58]) {
                        puVar61 = puVar60 + lVar58;
                        break;
                      }
                      lVar58 = lVar58 + 1;
                    } while (puVar65 != (uint32_t *)lVar58);
                  }
                  puVar62 = (uint32_t *)(puVar61 + -(long)puVar37);
LAB_0030471a:
                  if ((((uint32_t *)0x2 < puVar62) || ((uVar71 < 2 && (puVar62 == (uint32_t *)0x2)))
                      ) && (uVar35 = (long)puVar62 * 0x87 + 0x78f, local_1a0 < uVar35)) {
                    if (uVar71 != 0) {
                      uVar35 = uVar35 - ((0x1ca10U >> ((byte)uVar71 & 0xe) & 0xe) + 0x27);
                    }
                    if (local_1a0 < uVar35) {
                      puVar43 = puVar62;
                      local_1a0 = uVar35;
                      local_198 = puVar62;
                      local_130 = puVar55;
                    }
                  }
                }
              }
              uVar71 = uVar71 + 1;
            } while (uVar71 != (long)iVar39);
          }
          plVar2 = (long *)(ringbuffer + uVar57);
          uVar35 = *plVar2 * uVar11 >> 0x31;
          lVar58 = uVar35 << ((byte)uVar5 & 0x3f);
          puVar26 = (ulong *)(ringbuffer + uVar57);
          uVar4 = *(ushort *)((long)puVar8 + uVar35 * 2);
          uVar72 = (ulong)uVar4;
          uVar71 = 0;
          if (uVar63 <= uVar72) {
            uVar71 = uVar72 - uVar63;
          }
          do {
            if (uVar72 <= uVar71) break;
            uVar72 = uVar72 - 1;
            puVar65 = (uint32_t *)
                      (puVar41 +
                      -(ulong)puVar9[lVar58 + (ulong)((hasher->privat)._H6.block_mask_ &
                                                     (uint)uVar72)]);
            if ((puVar65 <= puVar25) && ((uint8_t *)((long)puVar43 + uVar57) <= ringbuffer_mask)) {
              uVar70 = (ulong)(puVar9[lVar58 + (ulong)((hasher->privat)._H6.block_mask_ &
                                                      (uint)uVar72)] & (uint)ringbuffer_mask);
              if (((uint8_t *)((long)puVar43 + uVar70) <= ringbuffer_mask) &&
                 ((ringbuffer[(long)((long)puVar43 + uVar57)] ==
                   ringbuffer[(long)((long)puVar43 + uVar70)] &&
                  ((int)*plVar2 == *(int *)(ringbuffer + uVar70))))) {
                puVar49 = (ulong *)(ringbuffer + uVar70 + 4);
                puVar54 = (ulong *)((long)plVar2 + 4);
                puVar36 = puVar49;
                for (puVar64 = (uint8_t *)((long)local_140 + -5); (uint8_t *)0x7 < puVar64;
                    puVar64 = puVar64 + -8) {
                  uVar70 = *puVar54;
                  uVar12 = *puVar36;
                  if (uVar70 == uVar12) {
                    puVar36 = puVar36 + 1;
                  }
                  else {
                    uVar13 = 0;
                    if ((uVar12 ^ uVar70) != 0) {
                      for (; ((uVar12 ^ uVar70) >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                      }
                    }
                    pCVar69 = (Command *)
                              ((long)puVar36 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar49));
                  }
                  if (uVar70 != uVar12) goto LAB_00304924;
                  puVar54 = puVar54 + 1;
                }
                puVar28 = puVar36;
                if (puVar64 != (uint8_t *)0x0) {
                  puVar28 = (ulong *)((long)puVar36 + (long)puVar64);
                  puVar60 = (uint8_t *)0x0;
                  do {
                    if (*(uint8_t *)((long)puVar36 + (long)puVar60) !=
                        *(uint8_t *)((long)puVar54 + (long)puVar60)) {
                      puVar28 = (ulong *)((long)puVar36 + (long)puVar60);
                      break;
                    }
                    puVar60 = puVar60 + 1;
                  } while (puVar64 != puVar60);
                }
                pCVar69 = (Command *)((long)puVar28 - (long)puVar49);
LAB_00304924:
                pCVar69 = (Command *)&pCVar69->copy_len_;
                iVar56 = 0x1f;
                if ((uint)puVar65 != 0) {
                  for (; (uint)puVar65 >> iVar56 == 0; iVar56 = iVar56 + -1) {
                  }
                }
                uVar70 = (ulong)(iVar56 * -0x1e + 0x780) + (long)pCVar69 * 0x87;
                if (local_1a0 < uVar70) {
                  puVar43 = (uint32_t *)pCVar69;
                  local_1a0 = uVar70;
                  local_198 = (uint32_t *)pCVar69;
                  local_130 = puVar65;
                }
              }
            }
          } while (puVar65 <= puVar25);
          puVar9[lVar58 + (ulong)(uVar38 & uVar4)] = (uint32_t)puVar41;
          *(ushort *)((long)puVar8 + uVar35 * 2) = uVar4 + 1;
          local_188 = local_198;
          if (local_1a0 == 0x7e4) {
            pHVar14 = (hasher->privat)._H6.common_;
            if (pHVar14->dict_num_matches < pHVar14->dict_num_lookups >> 7) {
              iVar56 = 0;
            }
            else {
              uVar71 = (ulong)((uint)((int)*puVar26 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
              puVar65 = (uint32_t *)pBVar10->hash_table_lengths;
              sVar27 = pHVar14->dict_num_lookups;
              iVar56 = 0;
              lVar58 = 0;
              do {
                sVar27 = sVar27 + 1;
                pHVar14->dict_num_lookups = sVar27;
                bVar32 = *(byte *)((long)puVar65 + uVar71);
                puVar64 = (uint8_t *)(ulong)bVar32;
                if (puVar64 != (uint8_t *)0x0) {
                  bVar74 = true;
                  if (puVar64 <= puVar46) {
                    pBVar17 = pBVar10->words;
                    puVar36 = (ulong *)(pBVar17->data +
                                       (ulong)pBVar17->offsets_by_length[(long)puVar64] +
                                       (ulong)pBVar10->hash_table_words[uVar71] * (long)puVar64);
                    puVar60 = puVar64;
                    puVar54 = puVar26;
                    puVar43 = (uint32_t *)ringbuffer_mask;
                    if (7 < bVar32) {
                      do {
                        uVar35 = *puVar36;
                        uVar72 = *puVar54;
                        if (uVar35 == uVar72) {
                          puVar54 = puVar54 + 1;
                        }
                        else {
                          uVar70 = 0;
                          if ((uVar72 ^ uVar35) != 0) {
                            for (; ((uVar72 ^ uVar35) >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
                            }
                          }
                          puVar43 = (uint32_t *)
                                    ((long)puVar54 + ((uVar70 >> 3 & 0x1fffffff) - (long)puVar26));
                        }
                        if (uVar35 != uVar72) goto LAB_00304efe;
                        puVar36 = puVar36 + 1;
                        puVar60 = puVar60 + -8;
                      } while ((uint8_t *)0x7 < puVar60);
                    }
                    puVar49 = puVar54;
                    if (puVar60 != (uint8_t *)0x0) {
                      puVar49 = (ulong *)((long)puVar54 + (long)puVar60);
                      lVar59 = 0;
                      do {
                        if (*(char *)((long)puVar54 + lVar59) != *(char *)((long)puVar36 + lVar59))
                        {
                          puVar49 = (ulong *)((long)puVar54 + lVar59);
                          break;
                        }
                        lVar59 = lVar59 + 1;
                      } while (puVar60 != (uint8_t *)lVar59);
                    }
                    puVar43 = (uint32_t *)((long)puVar49 - (long)puVar26);
LAB_00304efe:
                    if (((puVar43 != (uint32_t *)0x0) &&
                        (puVar64 < (uint8_t *)
                                   ((long)puVar43 + (ulong)pBVar10->cutoffTransformsCount))) &&
                       (puVar25 = (uint32_t *)
                                  ((long)puVar42 +
                                  ((ulong)((uint)(pBVar10->cutoffTransforms >>
                                                 ((char)((long)puVar64 - (long)puVar43) * '\x06' &
                                                 0x3fU)) & 0x3f) +
                                   ((long)puVar64 - (long)puVar43) * 4 <<
                                  (puVar64[(long)pBVar17] & 0x3f)) +
                                  (ulong)pBVar10->hash_table_words[uVar71] + lVar40),
                       puVar25 <= puVar31)) {
                      iVar20 = 0x1f;
                      if ((uint)puVar25 != 0) {
                        for (; (uint)puVar25 >> iVar20 == 0; iVar20 = iVar20 + -1) {
                        }
                      }
                      uVar35 = ((long)puVar43 * 0x87 - (ulong)(uint)(iVar20 * 0x1e)) + 0x780;
                      if (local_1a0 <= uVar35) {
                        iVar56 = (uint)bVar32 - (int)puVar43;
                        bVar74 = false;
                        local_198 = puVar43;
                        local_1a0 = uVar35;
                        local_130 = puVar25;
                      }
                    }
                  }
                  if (!bVar74) {
                    pHVar14->dict_num_matches = pHVar14->dict_num_matches + 1;
                  }
                }
                uVar71 = uVar71 + 1;
                bVar74 = lVar58 == 0;
                lVar58 = lVar58 + 1;
                local_188 = local_198;
              } while (bVar74);
            }
          }
          else {
            iVar56 = 0;
          }
          if (sVar73 != 0) {
            sVar27 = 0;
            do {
              pPVar16 = (params->dictionary).compound.chunks[sVar27];
              bVar32 = (byte)pPVar16->bucket_bits;
              bVar53 = (byte)pPVar16->slot_bits;
              bVar21 = -(char)pPVar16->hash_bits;
              uVar71 = ((*puVar26 << (bVar21 & 0x3f)) >> (bVar21 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                       (-bVar32 & 0x3f);
              lVar58 = (1L << (bVar53 & 0x3f)) * 4;
              lVar59 = (1L << (bVar32 & 0x3f)) * 2;
              bVar53 = -bVar53;
              puVar65 = (uint32_t *)CONCAT71((int7)((ulong)puVar65 >> 8),bVar53);
              puVar68 = (undefined8 *)
                        ((long)&pPVar16[1].magic + (ulong)pPVar16->num_items * 4 + lVar59 + lVar58);
              if (pPVar16->magic != 0xdebcede0) {
                puVar68 = (undefined8 *)*puVar68;
              }
              puVar64 = (uint8_t *)
                        ((long)puVar42 +
                        (sVar15 - (params->dictionary).compound.chunk_offsets[sVar27]));
              uVar35 = (ulong)pPVar16->source_size;
              uVar4 = *(ushort *)((long)&pPVar16[1].magic + (uVar71 & 0xffffffff) * 2 + lVar58);
              puVar44 = (uint *)((long)&pPVar16[1].magic +
                                (ulong)((uint)uVar4 +
                                       (&pPVar16[1].magic)
                                       [(uint)((int)uVar71 << (bVar53 & 0x1f)) >> (bVar53 & 0x1f)])
                                * 4 + lVar59 + lVar58);
              lVar58 = 0;
              local_198 = local_188;
              do {
                puVar43 = (uint32_t *)(long)dist_cache[lVar58];
                if ((puVar64 + -uVar35 < puVar43) && (puVar43 <= puVar64)) {
                  puVar60 = (uint8_t *)(uVar35 - ((long)puVar64 - (long)puVar43));
                  if (puVar46 <= puVar60) {
                    puVar60 = puVar46;
                  }
                  puVar49 = (ulong *)(((long)puVar64 - (long)puVar43) + (long)puVar68);
                  puVar54 = puVar26;
                  puVar36 = puVar49;
                  for (; (uint8_t *)0x7 < puVar60; puVar60 = puVar60 + -8) {
                    uVar71 = *puVar54;
                    uVar72 = *puVar36;
                    if (uVar71 == uVar72) {
                      puVar36 = puVar36 + 1;
                    }
                    else {
                      uVar70 = 0;
                      if ((uVar72 ^ uVar71) != 0) {
                        for (; ((uVar72 ^ uVar71) >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
                        }
                      }
                      puVar65 = (uint32_t *)
                                ((long)puVar36 + ((uVar70 >> 3 & 0x1fffffff) - (long)puVar49));
                    }
                    if (uVar71 != uVar72) goto LAB_00304b88;
                    puVar54 = puVar54 + 1;
                  }
                  puVar28 = puVar36;
                  if (puVar60 != (uint8_t *)0x0) {
                    puVar28 = (ulong *)((long)puVar36 + (long)puVar60);
                    lVar59 = 0;
                    do {
                      if (*(char *)((long)puVar36 + lVar59) != *(char *)((long)puVar54 + lVar59)) {
                        puVar28 = (ulong *)((long)puVar36 + lVar59);
                        break;
                      }
                      lVar59 = lVar59 + 1;
                    } while (puVar60 != (uint8_t *)lVar59);
                  }
                  puVar65 = (uint32_t *)((long)puVar28 - (long)puVar49);
LAB_00304b88:
                  if (((uint32_t *)0x1 < puVar65) &&
                     (uVar71 = (long)puVar65 * 0x87 + 0x78f, local_1a0 < uVar71)) {
                    if (lVar58 != 0) {
                      uVar71 = uVar71 - ((0x1ca10U >> ((byte)lVar58 & 2) & 4) + 0x27);
                    }
                    if (local_1a0 < uVar71) {
                      if (local_198 < puVar65) {
                        local_198 = puVar65;
                      }
                      iVar56 = 0;
                      local_1a0 = uVar71;
                      local_188 = puVar65;
                      local_130 = puVar43;
                    }
                  }
                }
                lVar58 = lVar58 + 1;
              } while (lVar58 != 4);
              if (uVar4 != 0xffff) {
                do {
                  uVar66 = *puVar44;
                  uVar71 = (ulong)(uVar66 & 0x7fffffff);
                  puVar43 = (uint32_t *)(puVar64 + -uVar71);
                  puVar60 = (uint8_t *)(uVar35 - uVar71);
                  if (puVar46 <= (uint8_t *)(uVar35 - uVar71)) {
                    puVar60 = puVar46;
                  }
                  if ((((puVar43 <= puVar31) &&
                       ((uint8_t *)((long)local_198 + uVar57) <= ringbuffer_mask)) &&
                      (local_198 < puVar60)) &&
                     (ringbuffer[(long)((long)local_198 + uVar57)] ==
                      *(uint8_t *)((long)puVar68 + (long)((long)local_198 + uVar71)))) {
                    puVar52 = (undefined8 *)(uVar71 + (long)puVar68);
                    puVar54 = puVar26;
                    puVar29 = puVar52;
                    puVar25 = local_198;
                    for (; (uint8_t *)0x7 < puVar60; puVar60 = puVar60 + -8) {
                      puVar65 = (uint32_t *)*puVar54;
                      puVar37 = (uint8_t *)*puVar29;
                      if (puVar65 == (uint32_t *)puVar37) {
                        puVar29 = puVar29 + 1;
                      }
                      else {
                        uVar71 = 0;
                        if (((ulong)puVar37 ^ (ulong)puVar65) != 0) {
                          for (; (((ulong)puVar37 ^ (ulong)puVar65) >> uVar71 & 1) == 0;
                              uVar71 = uVar71 + 1) {
                          }
                        }
                        puVar25 = (uint32_t *)
                                  ((long)puVar29 + ((uVar71 >> 3 & 0x1fffffff) - (long)puVar52));
                      }
                      if (puVar65 != (uint32_t *)puVar37) goto LAB_00304cf9;
                      puVar54 = puVar54 + 1;
                    }
                    puVar30 = puVar29;
                    if (puVar60 != (uint8_t *)0x0) {
                      puVar30 = (undefined8 *)((long)puVar29 + (long)puVar60);
                      puVar65 = (uint32_t *)0x0;
                      do {
                        if (*(uint8_t *)((long)puVar29 + (long)puVar65) !=
                            *(uint8_t *)((long)puVar54 + (long)puVar65)) {
                          puVar30 = (undefined8 *)((long)puVar29 + (long)puVar65);
                          break;
                        }
                        puVar65 = (uint32_t *)((long)puVar65 + 1);
                      } while ((uint32_t *)puVar60 != puVar65);
                    }
                    puVar25 = (uint32_t *)((long)puVar30 - (long)puVar52);
LAB_00304cf9:
                    if ((uint32_t *)0x3 < puVar25) {
                      iVar20 = 0x1f;
                      if ((uint)puVar43 != 0) {
                        for (; (uint)puVar43 >> iVar20 == 0; iVar20 = iVar20 + -1) {
                        }
                      }
                      uVar71 = (ulong)(iVar20 * -0x1e + 0x780) + (long)puVar25 * 0x87;
                      if (local_1a0 < uVar71) {
                        iVar56 = 0;
                        local_1a0 = uVar71;
                        local_198 = puVar25;
                        local_188 = puVar25;
                        local_130 = puVar43;
                      }
                    }
                  }
                  puVar44 = puVar44 + 1;
                } while (-1 < (int)uVar66);
              }
              sVar27 = sVar27 + 1;
            } while (sVar27 != sVar73);
          }
          bVar74 = local_170 + 0xaf <= local_1a0;
          iVar20 = iVar48;
          if (bVar74) {
            uVar45 = uVar45 + 1;
            local_170 = local_1a0;
            local_158 = local_130;
            local_e8 = local_188;
            local_174 = iVar56;
            local_148 = (uint32_t *)puVar41;
            iVar20 = iVar48 + 1;
          }
          bVar19 = iVar48 < 3;
          pCVar69 = commands;
          local_140 = (uint32_t *)puVar46;
          iVar48 = iVar20;
        } while (bVar74 && (bVar19 && (uint8_t *)((long)puVar34 + 9) < puVar1));
        puVar65 = (uint32_t *)((long)local_148 + sVar6);
        if (puVar3 <= (uint32_t *)((long)local_148 + sVar6)) {
          puVar65 = puVar3;
        }
        puVar46 = (uint8_t *)((long)puVar65 + sVar7);
        if (puVar46 < local_158) {
LAB_003053e1:
          puVar31 = (uint8_t *)((long)local_158 + 0xf);
        }
        else {
          uVar38 = 0;
          bVar74 = false;
          if (local_158 != (uint32_t *)(long)*dist_cache) {
            if (local_158 == (uint32_t *)(long)dist_cache[1]) {
              uVar38 = 1;
            }
            else {
              puVar31 = (uint8_t *)((long)local_158 + (3 - (long)(long)*dist_cache));
              if (puVar31 < (uint8_t *)0x7) {
                bVar32 = (byte)((int)puVar31 << 2);
                uVar38 = 0x9750468;
              }
              else {
                puVar31 = (uint8_t *)((long)local_158 + (3 - (long)(long)dist_cache[1]));
                if ((uint8_t *)0x6 < puVar31) {
                  if (local_158 != (uint32_t *)(long)dist_cache[2]) {
                    bVar74 = local_158 != (uint32_t *)(long)dist_cache[3];
                    uVar38 = 3;
                    goto LAB_003053d8;
                  }
                  uVar38 = 2;
                  goto LAB_003053d6;
                }
                bVar32 = (byte)((int)puVar31 << 2);
                uVar38 = 0xfdb1ace;
              }
              uVar38 = uVar38 >> (bVar32 & 0x1f) & 0xf;
            }
LAB_003053d6:
            bVar74 = false;
          }
LAB_003053d8:
          if (bVar74) goto LAB_003053e1;
          puVar31 = (uint8_t *)(ulong)uVar38;
        }
        if ((local_158 <= puVar46) && (puVar31 != (uint8_t *)0x0)) {
          dist_cache[3] = dist_cache[2];
          uVar18 = *(undefined8 *)dist_cache;
          *(undefined8 *)(dist_cache + 1) = uVar18;
          iVar48 = (int)local_158;
          *dist_cache = iVar48;
          iVar39 = (hasher->privat)._H6.num_last_distances_to_check_;
          if (4 < iVar39) {
            dist_cache[4] = iVar48 + -1;
            dist_cache[5] = iVar48 + 1;
            dist_cache[6] = iVar48 + -2;
            dist_cache[7] = iVar48 + 2;
            dist_cache[8] = iVar48 + -3;
            dist_cache[9] = iVar48 + 3;
            if (10 < iVar39) {
              iVar39 = (int)uVar18;
              dist_cache[10] = iVar39 + -1;
              dist_cache[0xb] = iVar39 + 1;
              dist_cache[0xc] = iVar39 + -2;
              dist_cache[0xd] = iVar39 + 2;
              *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar39 + 3,iVar39 + -3);
            }
          }
        }
        uVar38 = (uint)uVar45;
        local_100->insert_len_ = uVar38;
        local_100->copy_len_ = local_174 << 0x19 | (uint)local_e8;
        uVar57 = (ulong)(params->dist).num_direct_distance_codes;
        puVar46 = (uint8_t *)(uVar57 + 0x10);
        if (puVar31 < puVar46) {
          local_100->dist_prefix_ = (uint16_t)puVar31;
          uVar22 = 0;
        }
        else {
          uVar22 = (params->dist).distance_postfix_bits;
          bVar32 = (byte)uVar22;
          puVar31 = puVar31 + ((4L << (bVar32 & 0x3f)) - uVar57) + -0x10;
          uVar66 = 0x1f;
          if ((uint)puVar31 != 0) {
            for (; (uint)puVar31 >> uVar66 == 0; uVar66 = uVar66 - 1) {
            }
          }
          uVar66 = (uVar66 ^ 0xffffffe0) + 0x1f;
          bVar74 = ((ulong)puVar31 >> ((ulong)uVar66 & 0x3f) & 1) != 0;
          iVar39 = uVar66 - uVar22;
          local_100->dist_prefix_ =
               (short)((uint)bVar74 + iVar39 * 2 + 0xfffe << (bVar32 & 0x3f)) +
               (short)puVar46 + (~(ushort)(-1 << (bVar32 & 0x1f)) & (ushort)puVar31) |
               (short)iVar39 * 0x400;
          uVar22 = (uint32_t)
                   ((long)puVar31 - ((ulong)bVar74 + 2 << ((byte)uVar66 & 0x3f)) >> (bVar32 & 0x3f))
          ;
        }
        local_100->dist_extra_ = uVar22;
        if (5 < uVar45) {
          if (uVar45 < 0x82) {
            uVar38 = 0x1f;
            uVar66 = (uint)(uVar45 - 2);
            if (uVar66 != 0) {
              for (; uVar66 >> uVar38 == 0; uVar38 = uVar38 - 1) {
              }
            }
            uVar38 = (int)(uVar45 - 2 >> ((char)(uVar38 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar38 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (uVar45 < 0x842) {
            uVar66 = 0x1f;
            if (uVar38 - 0x42 != 0) {
              for (; uVar38 - 0x42 >> uVar66 == 0; uVar66 = uVar66 - 1) {
              }
            }
            uVar38 = (uVar66 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar38 = 0x15;
            if (0x1841 < uVar45) {
              uVar38 = (uint)(ushort)(0x17 - (uVar45 < 0x5842));
            }
          }
        }
        uVar66 = local_174 + (uint)local_e8;
        if (uVar66 < 10) {
          uVar67 = uVar66 - 2;
        }
        else if (uVar66 < 0x86) {
          uVar66 = uVar66 - 6;
          uVar67 = 0x1f;
          if (uVar66 != 0) {
            for (; uVar66 >> uVar67 == 0; uVar67 = uVar67 - 1) {
            }
          }
          uVar67 = (int)((ulong)(long)(int)uVar66 >> ((char)(uVar67 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar67 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar67 = 0x17;
          if (uVar66 < 0x846) {
            uVar67 = 0x1f;
            if (uVar66 - 0x46 != 0) {
              for (; uVar66 - 0x46 >> uVar67 == 0; uVar67 = uVar67 - 1) {
              }
            }
            uVar67 = (uVar67 ^ 0xffe0) + 0x2c;
          }
        }
        uVar4 = (ushort)uVar67;
        uVar47 = (uVar4 & 7) + ((ushort)uVar38 & 7) * 8;
        if ((((local_100->dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar38 < 8)) && (uVar4 < 0x10)) {
          if (7 < uVar4) {
            uVar47 = uVar47 + 0x40;
          }
        }
        else {
          iVar39 = ((uVar38 & 0xffff) >> 3) * 3 + ((uVar67 & 0xffff) >> 3);
          uVar47 = uVar47 + ((ushort)(0x520d40 >> ((char)iVar39 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar39 * 0x40 + 0x40;
        }
        local_100->cmd_prefix_ = uVar47;
        *num_literals = *num_literals + uVar45;
        position = (long)local_e8 + (long)local_148;
        puVar65 = puVar23;
        if (position < puVar23) {
          puVar65 = (uint32_t *)position;
        }
        puVar34 = (uint32_t *)((long)local_148 + 2);
        if (local_158 < (uint8_t *)((ulong)local_e8 >> 2)) {
          puVar43 = (uint32_t *)(position + -(long)local_158 * 4);
          if ((uint32_t *)(position + -(long)local_158 * 4) < puVar34) {
            puVar43 = puVar34;
          }
          puVar34 = puVar43;
          if (puVar65 < puVar43) {
            puVar34 = puVar65;
          }
        }
        puVar46 = (uint8_t *)((long)local_148 + lVar33 + (long)local_e8 * 2);
        local_100 = local_100 + 1;
        if (puVar34 < puVar65) {
          uVar11 = (hasher->privat)._H6.hash_mul_;
          uVar38 = (hasher->privat)._H6.block_mask_;
          uVar5 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
          do {
            uVar45 = *(long *)(ringbuffer + ((ulong)puVar34 & ringbuffer_mask)) * uVar11 >> 0x31;
            uVar4 = *(ushort *)((long)puVar8 + uVar45 * 2);
            *(ushort *)((long)puVar8 + uVar45 * 2) = uVar4 + 1;
            puVar9[(uVar45 << ((byte)uVar5 & 0x3f)) + (ulong)(uVar38 & uVar4)] = (uint32_t)puVar34;
            puVar34 = (uint32_t *)((long)puVar34 + 1);
          } while (puVar65 != puVar34);
          uVar45 = 0;
        }
        else {
          uVar45 = 0;
        }
      }
      local_148 = (uint32_t *)position;
    } while ((uint32_t *)(position + 8) < puVar1);
  }
  else {
    local_100 = commands;
  }
  *last_insert_len = (size_t)(puVar1 + (uVar45 - position));
  *num_commands = *num_commands + ((long)local_100 - (long)commands >> 4);
  return;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}